

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

time_point NodeClock::now(void)

{
  long lVar1;
  time_point tVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (g_mock_time._M_i.__r == 0) {
    tVar2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  }
  else {
    tVar2.__d.__r = (duration)((long)g_mock_time._M_i.__r * 1000000000);
  }
  if (0 < (long)tVar2.__d.__r) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (time_point)tVar2.__d.__r;
    }
    __stack_chk_fail();
  }
  __assert_fail("ret > 0s",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/time.cpp"
                ,0x1c,"static NodeClock::time_point NodeClock::now()");
}

Assistant:

NodeClock::time_point NodeClock::now() noexcept
{
    const auto mocktime{g_mock_time.load(std::memory_order_relaxed)};
    const auto ret{
        mocktime.count() ?
            mocktime :
            std::chrono::system_clock::now().time_since_epoch()};
    assert(ret > 0s);
    return time_point{ret};
}